

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::getLogLikelihood
          (BeagleCPUImpl<double,_1,_1> *this,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  *outSumLogLikelihood = 0.0;
  auVar6 = ZEXT816(0) << 0x40;
  iVar2 = this->kPatternCount;
  pdVar3 = this->gPatternWeights;
  pdVar4 = this->outLogLikelihoodsTmp;
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pdVar4[lVar5];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar3[lVar5];
    auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar1);
    *outSumLogLikelihood = auVar6._0_8_;
  }
  return (uint)!NAN(auVar6._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getLogLikelihood(double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    *outSumLogLikelihood = 0.0;
    for(int k=0; k < kPatternCount; k++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[k] * gPatternWeights[k];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}